

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
* __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FuncDefinition,std::default_delete<Rml::FuncDefinition>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::
doInsert<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FuncDefinition,std::default_delete<Rml::FuncDefinition>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FuncDefinition,std::default_delete<Rml::FuncDefinition>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>>
          (pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
           *__return_storage_ptr__,void *this,
          DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
          *keyval)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  pointer pcVar6;
  size_t __n;
  size_type *psVar7;
  FuncDefinition *__ptr;
  undefined8 uVar8;
  FuncDefinition *pFVar9;
  int iVar10;
  size_t sVar11;
  long lVar12;
  bool bVar13;
  ulong insertion_idx;
  uint8_t *puVar14;
  NodePtr pDVar15;
  string *this_00;
  uint uVar16;
  long lVar17;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  FuncDefinition *local_38;
  
  do {
    sVar11 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)keyval);
    uVar16 = ((uint)sVar11 & 0x1f) >> (*(byte *)((long)this + 0x2c) & 0x3f);
    iVar5 = *(int *)((long)this + 0x28);
    insertion_idx = sVar11 >> 5 & *(ulong *)((long)this + 0x18);
    lVar17 = *(long *)((long)this + 8);
    bVar4 = *(byte *)(lVar17 + insertion_idx);
    while( true ) {
      uVar16 = uVar16 + iVar5;
      if (bVar4 <= uVar16) break;
      bVar4 = *(byte *)(lVar17 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
    }
    if (uVar16 == bVar4) {
      pcVar6 = (keyval->mData).first._M_dataplus._M_p;
      __n = (keyval->mData).first._M_string_length;
      pDVar15 = (NodePtr)(insertion_idx * 0x28 + *this);
      do {
        if (__n == (pDVar15->mData).first._M_string_length) {
          if (__n != 0) {
            iVar10 = bcmp(pcVar6,(pDVar15->mData).first._M_dataplus._M_p,__n);
            if (iVar10 != 0) goto LAB_001fb51d;
          }
          puVar14 = (uint8_t *)(lVar17 + insertion_idx);
          bVar13 = false;
          goto LAB_001fb6d1;
        }
LAB_001fb51d:
        uVar16 = uVar16 + iVar5;
        pbVar3 = (byte *)(lVar17 + 1 + insertion_idx);
        insertion_idx = insertion_idx + 1;
        pDVar15 = pDVar15 + 1;
      } while (uVar16 == *pbVar3);
    }
    if (*(ulong *)((long)this + 0x10) < *(ulong *)((long)this + 0x20)) {
      if (0xff < iVar5 + uVar16) {
        *(undefined8 *)((long)this + 0x20) = 0;
      }
      lVar12 = 1;
      do {
        lVar12 = lVar12 + -1;
        pcVar2 = (char *)(lVar17 + insertion_idx);
        lVar17 = lVar17 + 1;
      } while (*pcVar2 != '\0');
      this_00 = (string *)(*this + insertion_idx * 0x28);
      if (lVar12 == 0) {
        *(string **)this_00 = this_00 + 0x10;
        pcVar6 = (keyval->mData).first._M_dataplus._M_p;
        paVar1 = &(keyval->mData).first.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 == paVar1) {
          uVar8 = *(undefined8 *)((long)&(keyval->mData).first.field_2 + 8);
          *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
          *(undefined8 *)(this_00 + 0x18) = uVar8;
        }
        else {
          *(pointer *)this_00 = pcVar6;
          *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
        }
        *(size_type *)(this_00 + 8) = (keyval->mData).first._M_string_length;
        (keyval->mData).first._M_dataplus._M_p = (pointer)paVar1;
        (keyval->mData).first._M_string_length = 0;
        (keyval->mData).first.field_2._M_local_buf[0] = '\0';
        *(FuncDefinition **)(this_00 + 0x20) =
             (keyval->mData).second._M_t.
             super___uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>.
             _M_t.
             super__Tuple_impl<0UL,_Rml::FuncDefinition_*,_std::default_delete<Rml::FuncDefinition>_>
             .super__Head_base<0UL,_Rml::FuncDefinition_*,_false>._M_head_impl;
        (keyval->mData).second._M_t.
        super___uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>._M_t.
        super__Tuple_impl<0UL,_Rml::FuncDefinition_*,_std::default_delete<Rml::FuncDefinition>_>.
        super__Head_base<0UL,_Rml::FuncDefinition_*,_false>._M_head_impl = (FuncDefinition *)0x0;
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,insertion_idx - lVar12,insertion_idx);
        local_58 = &local_48;
        psVar7 = (size_type *)(keyval->mData).first._M_dataplus._M_p;
        paVar1 = &(keyval->mData).first.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7 == paVar1) {
          local_48 = paVar1->_M_allocated_capacity;
          uStack_40 = *(undefined8 *)((long)&(keyval->mData).first.field_2 + 8);
        }
        else {
          local_48 = paVar1->_M_allocated_capacity;
          local_58 = psVar7;
        }
        local_50 = (keyval->mData).first._M_string_length;
        (keyval->mData).first._M_dataplus._M_p = (pointer)paVar1;
        (keyval->mData).first._M_string_length = 0;
        (keyval->mData).first.field_2._M_local_buf[0] = '\0';
        local_38 = (keyval->mData).second._M_t.
                   super___uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Rml::FuncDefinition_*,_std::default_delete<Rml::FuncDefinition>_>
                   .super__Head_base<0UL,_Rml::FuncDefinition_*,_false>._M_head_impl;
        (keyval->mData).second._M_t.
        super___uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>._M_t.
        super__Tuple_impl<0UL,_Rml::FuncDefinition_*,_std::default_delete<Rml::FuncDefinition>_>.
        super__Head_base<0UL,_Rml::FuncDefinition_*,_false>._M_head_impl = (FuncDefinition *)0x0;
        std::__cxx11::string::operator=(this_00,(string *)&local_58);
        pFVar9 = local_38;
        local_38 = (FuncDefinition *)0x0;
        __ptr = *(FuncDefinition **)(this_00 + 0x20);
        *(FuncDefinition **)(this_00 + 0x20) = pFVar9;
        if (__ptr != (FuncDefinition *)0x0) {
          std::default_delete<Rml::FuncDefinition>::operator()
                    ((default_delete<Rml::FuncDefinition> *)(this_00 + 0x20),__ptr);
          if (local_38 != (FuncDefinition *)0x0) {
            std::default_delete<Rml::FuncDefinition>::operator()
                      ((default_delete<Rml::FuncDefinition> *)&local_38,local_38);
          }
        }
        local_38 = (FuncDefinition *)0x0;
        if (local_58 != &local_48) {
          operator_delete(local_58,local_48 + 1);
        }
      }
      *(char *)(*(long *)((long)this + 8) + insertion_idx) = (char)uVar16;
      *(long *)((long)this + 0x10) = *(long *)((long)this + 0x10) + 1;
      pDVar15 = (NodePtr)(insertion_idx * 0x28 + *this);
      puVar14 = (uint8_t *)(insertion_idx + *(long *)((long)this + 8));
      bVar13 = true;
LAB_001fb6d1:
      (__return_storage_ptr__->first).mKeyVals = pDVar15;
      (__return_storage_ptr__->first).mInfo = puVar14;
      __return_storage_ptr__->second = bVar13;
      return __return_storage_ptr__;
    }
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
  } while( true );
}

Assistant:

std::pair<iterator, bool> doInsert(Arg&& keyval) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(getFirstConst(keyval), &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(getFirstConst(keyval), mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair<iterator, bool>(iterator(mKeyVals + idx, mInfo + idx),
                                                          false);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                ::new (static_cast<void*>(&l)) Node(*this, std::forward<Arg>(keyval));
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::forward<Arg>(keyval));
            }

            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return std::make_pair(iterator(mKeyVals + insertion_idx, mInfo + insertion_idx), true);
        }
    }